

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evotiming.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *__ptr;
  size_t sStack_60;
  int cnum;
  timeval end;
  timeval start;
  
  cnum = 0;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    do {
      while (iVar1 = getopt(argc,argv,"c:"), iVar1 == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
    } while (iVar1 != -1);
    if (cnum < nva_cardsnum) {
      uVar2 = 0;
      gettimeofday((timeval *)&start,(__timezone_ptr_t)0x0);
      gettimeofday((timeval *)&end,(__timezone_ptr_t)0x0);
      while ((ulong)((end.tv_sec - start.tv_sec) * 1000000 + (end.tv_usec - start.tv_usec)) <
             1000000) {
        evosend(cnum,0,0x80,0);
        gettimeofday((timeval *)&end,(__timezone_ptr_t)0x0);
        uVar2 = uVar2 + 1;
      }
      printf("%d evo 0x80 commands in 1 sec\n",(ulong)uVar2);
      return 0;
    }
    if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_60 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_60 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_60 = 0x12;
  }
  fwrite(__ptr,sStack_60,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	int c, i;
	int cnum =0;
	struct timeval start, end;

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	gettimeofday(&start, NULL);
	gettimeofday(&end, NULL);

	for (i=0 ; time_diff_us(start, end) < 1000000 ; i++) {
		evosend(cnum, 0, 0x80, 0);
		gettimeofday(&end, NULL);
	};

	printf("%d evo 0x80 commands in 1 sec\n", i);
	return 0;
}